

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF(VmaBlockMetadata_TLSF *this)

{
  VkAllocationCallbacks *pVVar1;
  VkAllocationCallbacks *this_00;
  VkAllocationCallbacks *in_RDI;
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *in_stack_00000010;
  size_t in_stack_ffffffffffffffe0;
  
  in_RDI->pUserData = &PTR__VmaBlockMetadata_TLSF_005310d8;
  if (in_RDI[6].pfnFree != (PFN_vkFreeFunction)0x0) {
    pVVar1 = VmaBlockMetadata::GetAllocationCallbacks((VmaBlockMetadata *)in_RDI);
    vma_delete_array<VmaBlockMetadata_TLSF::Block*>
              (in_RDI,(Block **)pVVar1,in_stack_ffffffffffffffe0);
  }
  pVVar1 = (VkAllocationCallbacks *)&in_RDI[7].pfnInternalFree;
  this_00 = VmaBlockMetadata::GetAllocationCallbacks((VmaBlockMetadata *)in_RDI);
  VmaBlockBufferImageGranularity::Destroy((VmaBlockBufferImageGranularity *)this_00,pVVar1);
  VmaBlockBufferImageGranularity::~VmaBlockBufferImageGranularity
            ((VmaBlockBufferImageGranularity *)&in_RDI[7].pfnInternalFree);
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::~VmaPoolAllocator(in_stack_00000010);
  VmaBlockMetadata::~VmaBlockMetadata((VmaBlockMetadata *)in_RDI);
  return;
}

Assistant:

VmaBlockMetadata_TLSF::~VmaBlockMetadata_TLSF()
{
    if (m_FreeList)
        vma_delete_array(GetAllocationCallbacks(), m_FreeList, m_ListsCount);
    m_GranularityHandler.Destroy(GetAllocationCallbacks());
}